

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HydroCmd.cpp
# Opt level: O0

void exchange(char **argv,custom_getopt_data *d)

{
  int iVar1;
  char *pcVar2;
  int i_1;
  int len_1;
  int i;
  int len;
  char *tem;
  int top;
  int middle;
  int bottom;
  custom_getopt_data *d_local;
  char **argv_local;
  
  bottom = d->first_nonopt;
  iVar1 = d->last_nonopt;
  top = d->custom_optind;
  while (iVar1 < top && bottom < iVar1) {
    if (iVar1 - bottom < top - iVar1) {
      for (i = 0; i < iVar1 - bottom; i = i + 1) {
        pcVar2 = argv[bottom + i];
        argv[bottom + i] = argv[(top - (iVar1 - bottom)) + i];
        argv[(top - (iVar1 - bottom)) + i] = pcVar2;
      }
      top = top - (iVar1 - bottom);
    }
    else {
      for (i_1 = 0; i_1 < top - iVar1; i_1 = i_1 + 1) {
        pcVar2 = argv[bottom + i_1];
        argv[bottom + i_1] = argv[iVar1 + i_1];
        argv[iVar1 + i_1] = pcVar2;
      }
      bottom = (top - iVar1) + bottom;
    }
  }
  d->first_nonopt = (d->custom_optind - d->last_nonopt) + d->first_nonopt;
  d->last_nonopt = d->custom_optind;
  return;
}

Assistant:

static void exchange(char **argv, struct custom_getopt_data *d)
{
	int bottom = d->first_nonopt;
	int middle = d->last_nonopt;
	int top = d->custom_optind;
	char *tem;

	/*
	 * Exchange the shorter segment with the far end of the longer segment.
	 * That puts the shorter segment into the right place.  It leaves the
	 * longer segment in the right place overall, but it consists of two
	 * parts that need to be swapped next.
	 */
	while (top > middle && middle > bottom) {
		if (top - middle > middle - bottom) {
			/* Bottom segment is the short one.  */
			int len = middle - bottom;
			int i;

			/* Swap it with the top part of the top segment.  */
			for (i = 0; i < len; i++) {
				tem = argv[bottom + i];
				argv[bottom + i] =
					argv[top - (middle - bottom) + i];
				argv[top - (middle - bottom) + i] = tem;
			}
			/* Exclude the moved bottom segment from further swapping.  */
			top -= len;
		} else {
			/* Top segment is the short one.  */
			int len = top - middle;
			int i;

			/* Swap it with the bottom part of the bottom segment.  */
			for (i = 0; i < len; i++) {
				tem = argv[bottom + i];
				argv[bottom + i] = argv[middle + i];
				argv[middle + i] = tem;
			}
			/* Exclude the moved top segment from further swapping.  */
			bottom += len;
		}
	}
	/* Update records for the slots the non-options now occupy.  */
	d->first_nonopt += (d->custom_optind - d->last_nonopt);
	d->last_nonopt = d->custom_optind;
}